

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void test_abstract_factory(void)

{
  element_type *peVar1;
  element_type *peVar2;
  ostream *poVar3;
  element_type *peVar4;
  allocator local_151;
  string local_150 [32];
  shared_ptr<abstract_factory::ICloth> local_130;
  string local_120 [32];
  shared_ptr<abstract_factory::IBall> local_100;
  string local_f0 [32];
  shared_ptr<abstract_factory::FootballAbstractFactory> local_d0;
  shared_ptr<abstract_factory::ICloth> local_c0;
  string local_b0 [32];
  shared_ptr<abstract_factory::IBall> local_90;
  string local_80 [32];
  shared_ptr<abstract_factory::BasketballAbstractFactory> local_60;
  undefined1 local_50 [8];
  shared_ptr<abstract_factory::IAbstractFactory> abstract_factory;
  allocator local_29;
  string local_28 [32];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"abstract factory",&local_29);
  print_func_begin((string *)local_28);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  std::make_shared<abstract_factory::BasketballAbstractFactory>();
  std::shared_ptr<abstract_factory::IAbstractFactory>::
  shared_ptr<abstract_factory::BasketballAbstractFactory,void>
            ((shared_ptr<abstract_factory::IAbstractFactory> *)local_50,&local_60);
  std::shared_ptr<abstract_factory::BasketballAbstractFactory>::~shared_ptr(&local_60);
  peVar1 = std::
           __shared_ptr_access<abstract_factory::IAbstractFactory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<abstract_factory::IAbstractFactory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_50);
  (**peVar1->_vptr_IAbstractFactory)(&local_90);
  peVar2 = std::
           __shared_ptr_access<abstract_factory::IBall,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<abstract_factory::IBall,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&local_90);
  (*peVar2->_vptr_IBall[2])(local_80);
  poVar3 = std::operator<<((ostream *)&std::cout,local_80);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_80);
  std::shared_ptr<abstract_factory::IBall>::~shared_ptr(&local_90);
  peVar1 = std::
           __shared_ptr_access<abstract_factory::IAbstractFactory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<abstract_factory::IAbstractFactory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_50);
  (*peVar1->_vptr_IAbstractFactory[1])(&local_c0);
  peVar4 = std::
           __shared_ptr_access<abstract_factory::ICloth,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<abstract_factory::ICloth,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&local_c0);
  (*peVar4->_vptr_ICloth[2])(local_b0);
  poVar3 = std::operator<<((ostream *)&std::cout,local_b0);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_b0);
  std::shared_ptr<abstract_factory::ICloth>::~shared_ptr(&local_c0);
  std::make_shared<abstract_factory::FootballAbstractFactory>();
  std::shared_ptr<abstract_factory::IAbstractFactory>::operator=
            ((shared_ptr<abstract_factory::IAbstractFactory> *)local_50,&local_d0);
  std::shared_ptr<abstract_factory::FootballAbstractFactory>::~shared_ptr(&local_d0);
  peVar1 = std::
           __shared_ptr_access<abstract_factory::IAbstractFactory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<abstract_factory::IAbstractFactory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_50);
  (**peVar1->_vptr_IAbstractFactory)(&local_100);
  peVar2 = std::
           __shared_ptr_access<abstract_factory::IBall,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<abstract_factory::IBall,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&local_100);
  (*peVar2->_vptr_IBall[2])(local_f0);
  poVar3 = std::operator<<((ostream *)&std::cout,local_f0);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_f0);
  std::shared_ptr<abstract_factory::IBall>::~shared_ptr(&local_100);
  peVar1 = std::
           __shared_ptr_access<abstract_factory::IAbstractFactory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<abstract_factory::IAbstractFactory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_50);
  (*peVar1->_vptr_IAbstractFactory[1])(&local_130);
  peVar4 = std::
           __shared_ptr_access<abstract_factory::ICloth,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<abstract_factory::ICloth,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&local_130);
  (*peVar4->_vptr_ICloth[2])(local_120);
  poVar3 = std::operator<<((ostream *)&std::cout,local_120);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_120);
  std::shared_ptr<abstract_factory::ICloth>::~shared_ptr(&local_130);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_150,"abstract factory",&local_151);
  print_func_end((string *)local_150);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  std::shared_ptr<abstract_factory::IAbstractFactory>::~shared_ptr
            ((shared_ptr<abstract_factory::IAbstractFactory> *)local_50);
  return;
}

Assistant:

void test_abstract_factory() {
    print_func_begin("abstract factory");
    std::shared_ptr<abstract_factory::IAbstractFactory> abstract_factory =
            std::make_shared<abstract_factory::BasketballAbstractFactory>();
    std::cout << abstract_factory->GetBall()->GetBallName() << std::endl;
    std::cout << abstract_factory->GetCloth()->GetClothName() << std::endl;

    abstract_factory =
            std::make_shared<abstract_factory::FootballAbstractFactory>();
    std::cout << abstract_factory->GetBall()->GetBallName() << std::endl;
    std::cout << abstract_factory->GetCloth()->GetClothName() << std::endl;

    print_func_end("abstract factory");
}